

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int VP8LDecodeAlphaHeader(ALPHDecoder *alph_dec,uint8_t *data,size_t data_size)

{
  int iVar1;
  uint uVar2;
  HTreeGroup *pHVar3;
  long lVar4;
  int iVar5;
  VP8LDecoder *dec;
  long lVar6;
  uint32_t *puVar7;
  
  dec = VP8LNew();
  if (dec != (VP8LDecoder *)0x0) {
    iVar5 = alph_dec->width_;
    dec->width_ = iVar5;
    iVar1 = alph_dec->height_;
    dec->height_ = iVar1;
    dec->io_ = &alph_dec->io_;
    (alph_dec->io_).opaque = alph_dec;
    (alph_dec->io_).width = iVar5;
    (alph_dec->io_).height = iVar1;
    dec->status_ = VP8_STATUS_OK;
    VP8LInitBitReader(&dec->br_,data,data_size);
    iVar5 = DecodeImageStream(alph_dec->width_,alph_dec->height_,1,dec,(uint32_t **)0x0);
    if (iVar5 != 0) {
      if (((dec->next_transform_ == 1) && (dec->transforms_[0].type_ == COLOR_INDEXING_TRANSFORM))
         && ((dec->hdr_).color_cache_size_ < 1)) {
        uVar2 = (dec->hdr_).num_htree_groups_;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        lVar6 = 0;
        do {
          if ((ulong)uVar2 * 0x238 + 0x238 == lVar6 + 0x238) {
            alph_dec->use_8b_decode_ = 1;
            dec->argb_cache_ = (uint32_t *)0x0;
            puVar7 = (uint32_t *)WebPSafeMalloc((long)dec->height_ * (long)dec->width_,1);
            dec->pixels_ = puVar7;
            if (puVar7 != (uint32_t *)0x0) goto LAB_0010e268;
            dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
            goto LAB_0010e30a;
          }
          pHVar3 = (dec->hdr_).htree_groups_;
        } while (((**(char **)((long)pHVar3->htrees + lVar6 + 8) == '\0') &&
                 (**(char **)((long)pHVar3->htrees + lVar6 + 0x10) == '\0')) &&
                (lVar4 = lVar6 + 0x18, lVar6 = lVar6 + 0x238,
                **(char **)((long)pHVar3->htrees + lVar4) == '\0'));
      }
      alph_dec->use_8b_decode_ = 0;
      iVar5 = AllocateInternalBuffers32b(dec,alph_dec->width_);
      if (iVar5 != 0) {
LAB_0010e268:
        alph_dec->vp8l_dec_ = dec;
        return 1;
      }
    }
LAB_0010e30a:
    VP8LDelete(dec);
  }
  return 0;
}

Assistant:

int VP8LDecodeAlphaHeader(ALPHDecoder* const alph_dec,
                          const uint8_t* const data, size_t data_size) {
  int ok = 0;
  VP8LDecoder* dec = VP8LNew();

  if (dec == NULL) return 0;

  assert(alph_dec != NULL);

  dec->width_ = alph_dec->width_;
  dec->height_ = alph_dec->height_;
  dec->io_ = &alph_dec->io_;
  dec->io_->opaque = alph_dec;
  dec->io_->width = alph_dec->width_;
  dec->io_->height = alph_dec->height_;

  dec->status_ = VP8_STATUS_OK;
  VP8LInitBitReader(&dec->br_, data, data_size);

  if (!DecodeImageStream(alph_dec->width_, alph_dec->height_, 1, dec, NULL)) {
    goto Err;
  }

  // Special case: if alpha data uses only the color indexing transform and
  // doesn't use color cache (a frequent case), we will use DecodeAlphaData()
  // method that only needs allocation of 1 byte per pixel (alpha channel).
  if (dec->next_transform_ == 1 &&
      dec->transforms_[0].type_ == COLOR_INDEXING_TRANSFORM &&
      Is8bOptimizable(&dec->hdr_)) {
    alph_dec->use_8b_decode_ = 1;
    ok = AllocateInternalBuffers8b(dec);
  } else {
    // Allocate internal buffers (note that dec->width_ may have changed here).
    alph_dec->use_8b_decode_ = 0;
    ok = AllocateInternalBuffers32b(dec, alph_dec->width_);
  }

  if (!ok) goto Err;

  // Only set here, once we are sure it is valid (to avoid thread races).
  alph_dec->vp8l_dec_ = dec;
  return 1;

 Err:
  VP8LDelete(dec);
  return 0;
}